

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O0

XMLCh * __thiscall
PSVIWriterHandlers::translateValueConstraint
          (PSVIWriterHandlers *this,VALUE_CONSTRAINT constraintKind)

{
  VALUE_CONSTRAINT constraintKind_local;
  PSVIWriterHandlers *this_local;
  
  if (constraintKind == VALUE_CONSTRAINT_DEFAULT) {
    this_local = (PSVIWriterHandlers *)&xercesc_4_0::PSVIUni::fgDefault;
  }
  else if (constraintKind == VALUE_CONSTRAINT_FIXED) {
    this_local = (PSVIWriterHandlers *)&xercesc_4_0::PSVIUni::fgVCFixed;
  }
  else {
    this_local = (PSVIWriterHandlers *)&xercesc_4_0::PSVIUni::fgUnknown;
  }
  return (XMLCh *)this_local;
}

Assistant:

const XMLCh* PSVIWriterHandlers::translateValueConstraint(XSConstants::VALUE_CONSTRAINT constraintKind) {
	switch (constraintKind) {
		case XSConstants::VALUE_CONSTRAINT_DEFAULT :
			return PSVIUni::fgDefault;
		case XSConstants::VALUE_CONSTRAINT_FIXED :
			return PSVIUni::fgVCFixed;
		default :
			return PSVIUni::fgUnknown;
	}
}